

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

ze_image_format_type_t to_format_type(string *format_type)

{
  bool bVar1;
  ze_image_format_type_t zVar2;
  
  bVar1 = std::operator==(format_type,"UINT");
  zVar2 = ZE_IMAGE_FORMAT_TYPE_UINT;
  if (!bVar1) {
    bVar1 = std::operator==(format_type,"SINT");
    if (bVar1) {
      zVar2 = ZE_IMAGE_FORMAT_TYPE_SINT;
    }
    else {
      bVar1 = std::operator==(format_type,"UNORM");
      if (bVar1) {
        zVar2 = ZE_IMAGE_FORMAT_TYPE_UNORM;
      }
      else {
        bVar1 = std::operator==(format_type,"SNORM");
        if (bVar1) {
          zVar2 = ZE_IMAGE_FORMAT_TYPE_SNORM;
        }
        else {
          bVar1 = std::operator==(format_type,"FLOAT");
          if (bVar1) {
            zVar2 = ZE_IMAGE_FORMAT_TYPE_FLOAT;
          }
          else {
            std::operator<<((ostream *)&std::cout,"Unknown ze_image_format_type_t value: ");
            zVar2 = ~ZE_IMAGE_FORMAT_TYPE_UINT;
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_format_type_t to_format_type(const std::string format_type) {
  if (format_type == "UINT") {
    return ZE_IMAGE_FORMAT_TYPE_UINT;
  } else if (format_type == "SINT") {
    return ZE_IMAGE_FORMAT_TYPE_SINT;
  } else if (format_type == "UNORM") {
    return ZE_IMAGE_FORMAT_TYPE_UNORM;
  } else if (format_type == "SNORM") {
    return ZE_IMAGE_FORMAT_TYPE_SNORM;
  } else if (format_type == "FLOAT") {
    return ZE_IMAGE_FORMAT_TYPE_FLOAT;
  } else {
    std::cout << "Unknown ze_image_format_type_t value: ";
    return (static_cast<ze_image_format_type_t>(-1));
  }
}